

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::main(void)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  long col;
  TPZVec<int> NumConnected;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZFMatrix<float> KEl2;
  TPZFMatrix<float> KEl1;
  TPZFMatrix<float> KEl3;
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> TestFront;
  
  TPZFMatrix<float>::TPZFMatrix(&KEl1,2,2);
  pfVar2 = TPZFMatrix<float>::operator()(&KEl1,0,0);
  *pfVar2 = 4.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl1,0,1);
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl1,1,0);
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl1,1,1);
  *pfVar2 = 12.0;
  TPZVec<long>::TPZVec(&DestInd1,2);
  *DestInd1.fStore = 0;
  DestInd1.fStore[1] = 1;
  TPZFMatrix<float>::TPZFMatrix(&KEl2,4,4);
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,0,0);
  *pfVar2 = 4.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,0,1);
  *pfVar2 = -6.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,0,2);
  *pfVar2 = 2.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,0,3);
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,1,1);
  *pfVar2 = 12.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,1,2);
  *pfVar2 = -6.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,1,3);
  *pfVar2 = -12.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,2,2);
  *pfVar2 = 4.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,2,3);
  *pfVar2 = 6.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl2,3,3);
  *pfVar2 = 12.0;
  for (lVar3 = 0; col = lVar3, lVar3 != 4; lVar3 = lVar3 + 1) {
    for (; col != 4; col = col + 1) {
      pfVar2 = TPZFMatrix<float>::operator()(&KEl2,lVar3,col);
      fVar1 = *pfVar2;
      pfVar2 = TPZFMatrix<float>::operator()(&KEl2,col,lVar3);
      *pfVar2 = fVar1;
    }
  }
  TPZVec<long>::TPZVec(&DestInd2,4);
  *DestInd2.fStore = 0;
  DestInd2.fStore[1] = 1;
  DestInd2.fStore[2] = 2;
  DestInd2.fStore[3] = 3;
  TPZFMatrix<float>::TPZFMatrix(&KEl3,2,2);
  pfVar2 = TPZFMatrix<float>::operator()(&KEl3,0,0);
  *pfVar2 = 3.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl3,0,1);
  *pfVar2 = 3.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl1,1,0);
  *pfVar2 = 3.0;
  pfVar2 = TPZFMatrix<float>::operator()(&KEl3,1,1);
  *pfVar2 = 6.0;
  TPZVec<long>::TPZVec(&DestInd3,2);
  *DestInd3.fStore = 2;
  DestInd3.fStore[1] = 3;
  TPZFrontMatrix(&TestFront,4);
  TPZVec<int>::TPZVec(&NumConnected,4);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    NumConnected.fStore[lVar3] = 2;
  }
  SetNumElConnected(&TestFront,&NumConnected);
  SymbolicAddKel(&TestFront,&DestInd1);
  SymbolicAddKel(&TestFront,&DestInd2);
  SymbolicAddKel(&TestFront,&DestInd3);
  AllocData(&TestFront);
  SetNumElConnected(&TestFront,&NumConnected);
  AddKel(&TestFront,&KEl1,&DestInd1);
  AddKel(&TestFront,&KEl2,&DestInd2);
  AddKel(&TestFront,&KEl3,&DestInd3);
  TPZVec<int>::~TPZVec(&NumConnected);
  ~TPZFrontMatrix(&TestFront);
  TPZVec<long>::~TPZVec(&DestInd3);
  TPZFMatrix<float>::~TPZFMatrix(&KEl3);
  TPZVec<long>::~TPZVec(&DestInd2);
  TPZFMatrix<float>::~TPZFMatrix(&KEl2);
  TPZVec<long>::~TPZVec(&DestInd1);
  TPZFMatrix<float>::~TPZFMatrix(&KEl1);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}